

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.cc
# Opt level: O2

Node verona::make_fq(Lookup *lookup,bool fresh)

{
  TokenDef *pTVar1;
  bool bVar2;
  int iVar3;
  undefined1 *puVar4;
  TokenDef *pTVar5;
  undefined4 in_EDX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *__child_stack_02;
  void *__child_stack_03;
  void *__child_stack_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined7 in_register_00000031;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  void *in_R8;
  Node NVar8;
  Node path;
  Node t;
  Node node;
  undefined1 local_438 [16];
  undefined1 local_428 [40];
  undefined1 local_400 [40];
  undefined1 local_3d8 [24];
  WFLookup local_3c0;
  element_type *local_3a0;
  undefined1 local_398 [16];
  Node local_388;
  Node local_378;
  undefined1 local_368 [16];
  Node local_358;
  TokenDef local_348;
  Node local_338;
  Token local_328;
  Token local_320;
  Token local_318;
  undefined1 local_310 [16];
  Node local_300;
  Node local_2f0;
  Node local_2e0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_2d0;
  undefined1 local_2c0 [16];
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_2b0;
  undefined1 local_2a0 [16];
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_290;
  undefined1 local_280 [16];
  Node local_270;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_260;
  undefined1 local_250 [16];
  Node local_240;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_220;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_200;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1f0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1e0;
  Node local_1d0;
  trieste local_1c0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_1b0;
  trieste local_1a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_190;
  trieste local_180 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  trieste local_170 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_160;
  trieste local_150 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  trieste local_140 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_130;
  trieste local_120 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  trieste local_110 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  Node local_100;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_f0;
  trieste local_e0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  trieste local_d0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  Node local_c0;
  __shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> local_b0;
  trieste local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  trieste local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  trieste local_80 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  trieste local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  trieste local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  trieste local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  trieste local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(in_register_00000031,fresh);
  puVar4 = local_428;
  local_428._0_8_ = Class;
  local_428._8_8_ = TypeAlias;
  local_428._16_8_ = TypeParam;
  local_428._24_8_ = Trait;
  local_428._32_8_ = Function;
  local_400._8_8_ = (element_type *)0x5;
  local_400._0_8_ = puVar4;
  local_3d8._20_4_ = in_EDX;
  bVar2 = trieste::Token::in(&((element_type *)p_Var7->_vptr__Sp_counted_base)->type_,
                             (initializer_list<trieste::Token> *)local_400);
  if (bVar2) {
    local_3a0 = (element_type *)lookup;
    trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_438);
    local_400._32_8_ = p_Var7;
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_3d8,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)p_Var7);
    while( true ) {
      iVar3 = (int)puVar4;
      if ((element_type *)local_3d8._0_8_ == (element_type *)0x0) break;
      pTVar1 = ((Token *)(local_3d8._0_8_ + 0x10))->def;
      pTVar5 = (TokenDef *)(ulong)local_3d8[0x14];
      if (pTVar1 == (TokenDef *)Class) {
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_230,
                   (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438);
        trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_250);
        local_400._0_8_ = Ident;
        trieste::operator/((WFLookup *)local_428,(Node *)local_3d8,(Token *)local_400);
        ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_b0,
                   (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8));
        trieste::clone(local_a0,(__fn *)&local_b0,__child_stack_01,iVar3,in_R8);
        trieste::operator<<((trieste *)&local_240,(Node *)local_250,(Node *)local_a0);
        make_typeargs(&local_c0,(Lookup *)local_3d8,SUB81(local_400._32_8_,0));
        trieste::operator<<(local_90,&local_240,&local_c0);
        trieste::operator<<(local_40,(Node *)&local_230,(Node *)local_90);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_c0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_240.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 0x10));
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
        this = &local_230._M_refcount;
        puVar4 = (undefined1 *)pTVar5;
LAB_00138ea8:
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
      }
      else {
        iVar3 = 0x276d30;
        if (pTVar1 == (TokenDef *)TypeAlias) {
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_260,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438);
          trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_280);
          local_400._0_8_ = Ident;
          trieste::operator/((WFLookup *)local_428,(Node *)local_3d8,(Token *)local_400);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_f0,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8));
          trieste::clone(local_e0,(__fn *)&local_f0,__child_stack_02,iVar3,in_R8);
          trieste::operator<<((trieste *)&local_270,(Node *)local_280,(Node *)local_e0);
          make_typeargs(&local_100,(Lookup *)local_3d8,SUB81(local_400._32_8_,0));
          trieste::operator<<(local_d0,&local_270,&local_100);
          trieste::operator<<(local_50,(Node *)&local_260,(Node *)local_d0);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_100.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_270.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 0x10));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_280 + 8));
          this = &local_260._M_refcount;
          puVar4 = (undefined1 *)pTVar5;
          goto LAB_00138ea8;
        }
        puVar4 = TypeParam;
        if (pTVar1 == (TokenDef *)TypeParam) {
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_290,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438);
          trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_2a0);
          local_400._0_8_ = Ident;
          trieste::operator/((WFLookup *)local_428,(Node *)local_3d8,(Token *)local_400);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_130,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8));
          trieste::clone(local_120,(__fn *)&local_130,__child_stack_03,(int)puVar4,in_R8);
          trieste::operator<<(local_110,(Node *)local_2a0,(Node *)local_120);
          trieste::operator<<(local_60,(Node *)&local_290,(Node *)local_110);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130._M_refcount)
          ;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 0x10));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
          this = &local_290._M_refcount;
          goto LAB_00138ea8;
        }
        puVar4 = Trait;
        if (pTVar1 == (TokenDef *)Trait) {
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_2b0,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438);
          trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_2c0);
          local_400._0_8_ = Ident;
          trieste::operator/((WFLookup *)local_428,(Node *)local_3d8,(Token *)local_400);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_160,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8));
          trieste::clone(local_150,(__fn *)&local_160,__child_stack_04,(int)puVar4,in_R8);
          trieste::operator<<(local_140,(Node *)local_2c0,(Node *)local_150);
          trieste::operator<<(local_70,(Node *)&local_2b0,(Node *)local_140);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_160._M_refcount)
          ;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 0x10));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2c0 + 8));
          this = &local_2b0._M_refcount;
          goto LAB_00138ea8;
        }
        iVar3 = 0x276f10;
        puVar4 = Function;
        if (pTVar1 == (TokenDef *)Function) {
          local_3c0.wf = (Wellformed *)Params;
          trieste::operator/((WFLookup *)local_400,(Node *)local_3d8,(Token *)&local_3c0);
          ::std::__cxx11::to_string
                    ((string *)local_428,
                     (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_400._8_8_ + 0x60)
                           )->_vptr__Sp_counted_base -
                     (long)(((Nodes *)
                            &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_400._8_8_ + 0x50))->_M_use_count)->
                           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 4);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 0x10));
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_2d0,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438);
          trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_310);
          local_318.def = (TokenDef *)Ref;
          trieste::operator/((WFLookup *)local_400,(Node *)local_3d8,&local_318);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_190,
                     (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
          trieste::clone(local_180,(__fn *)&local_190,__child_stack,iVar3,in_R8);
          trieste::operator<<((trieste *)&local_300,(Node *)local_310,(Node *)local_180);
          local_320.def = (TokenDef *)Ident;
          trieste::operator/(&local_3c0,(Node *)local_3d8,&local_320);
          ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_1b0,
                     &local_3c0.node.
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>);
          trieste::clone(local_1a0,(__fn *)&local_1b0,__child_stack_00,iVar3,in_R8);
          trieste::operator<<((trieste *)&local_2f0,&local_300,(Node *)local_1a0);
          local_328.def = (TokenDef *)Int;
          trieste::operator^(local_1c0,&local_328,(string *)local_428);
          trieste::operator<<((trieste *)&local_2e0,&local_2f0,(Node *)local_1c0);
          make_typeargs(&local_1d0,(Lookup *)local_3d8,SUB81(local_400._32_8_,0));
          trieste::operator<<(local_170,&local_2e0,&local_1d0);
          trieste::operator<<(local_80,(Node *)&local_2d0,(Node *)local_170);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1d0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_2e0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_2f0.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_198);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0._M_refcount)
          ;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_3c0.node.
                      super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_300.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178);
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount)
          ;
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 0x10));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_310 + 8));
          ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0._M_refcount)
          ;
          ::std::__cxx11::string::~string((string *)local_428);
          puVar4 = (undefined1 *)pTVar5;
        }
      }
      local_428._0_8_ = Class;
      local_428._8_8_ = TypeAlias;
      local_428._16_8_ = Trait;
      local_428._24_8_ = Function;
      local_3c0.wf = (Wellformed *)local_428;
      local_3c0.node.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x4;
      trieste::NodeDef::parent
                ((NodeDef *)local_400,(initializer_list<trieste::Token> *)local_3d8._0_8_);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_3d8,
                 (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_400);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_400 + 8));
    }
    ::std::
    __reverse<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>
              ((((Nodes *)(local_438._0_8_ + 0x58))->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (((Nodes *)(local_438._0_8_ + 0x58))->
               super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    lookup = (Lookup *)local_3a0;
    trieste::NodeDef::pop_back((NodeDef *)local_428);
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_3d8,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_428);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_428 + 8));
    local_428._0_8_ = TypeClassName;
    local_428._8_8_ = &TypeAliasName;
    local_428._16_8_ = TypeParamName;
    local_428._24_8_ = TypeTraitName;
    local_400._8_8_ = (element_type *)0x4;
    local_400._0_8_ = (NodeDef *)local_428;
    bVar2 = trieste::Token::in((Token *)(local_3d8._0_8_ + 0x10),
                               (initializer_list<trieste::Token> *)local_400);
    if (bVar2) {
      trieste::TokenDef::operator_cast_to_shared_ptr(&local_348);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1e0,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438)
      ;
      trieste::operator<<((trieste *)&local_338,(Node *)&local_348,(Node *)&local_1e0);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_1f0,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_3d8)
      ;
      trieste::operator<<((trieste *)lookup,&local_338,(Node *)&local_1f0);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f0._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_338.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e0._M_refcount);
      pTVar1 = &local_348;
    }
    else {
      if ((((Nodes *)(local_438._0_8_ + 0x58))->
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          )._M_impl.super__Vector_impl_data._M_start ==
          (((Nodes *)(local_438._0_8_ + 0x58))->
          super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("!path->empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/lookup.cc"
                      ,0x18a,"Node verona::make_fq(Lookup &, bool)");
      }
      trieste::NodeDef::pop_back((NodeDef *)local_428);
      trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_368);
      trieste::TokenDef::operator_cast_to_shared_ptr((TokenDef *)local_398);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_200,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_438)
      ;
      trieste::operator<<((trieste *)&local_388,(Node *)local_398,(Node *)&local_200);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_210,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_428)
      ;
      trieste::operator<<((trieste *)&local_378,&local_388,(Node *)&local_210);
      trieste::operator<<((trieste *)&local_358,(Node *)local_368,&local_378);
      ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_220,(__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)local_3d8)
      ;
      trieste::operator<<((trieste *)lookup,&local_358,(Node *)&local_220);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_358.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_378.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_388.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_200._M_refcount);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_398 + 8));
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_368 + 8));
      pTVar1 = (TokenDef *)local_428;
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pTVar1->fl);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    ::std::__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)lookup,
               (__shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2> *)p_Var7);
    _Var6._M_pi = extraout_RDX;
  }
  NVar8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  NVar8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)lookup;
  return (Node)NVar8.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Node make_fq(Lookup& lookup, bool fresh)
  {
    if (!lookup.def->in({Class, TypeAlias, TypeParam, Trait, Function}))
      return lookup.def;

    Node path = TypePath;
    auto node = lookup.def;

    while (node)
    {
      if (node == Class)
      {
        path
          << (TypeClassName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeAlias)
      {
        path
          << (TypeAliasName << clone(node / Ident)
                            << make_typeargs(node, lookup, fresh));
      }
      else if (node == TypeParam)
      {
        path << (TypeParamName << clone(node / Ident));
      }
      else if (node == Trait)
      {
        path << (TypeTraitName << clone(node / Ident));
      }
      else if (node == Function)
      {
        auto arity = std::to_string((node / Params)->size());

        path
          << (Selector << clone(node / Ref) << clone(node / Ident)
                       << (Int ^ arity) << make_typeargs(node, lookup, fresh));
      }

      node = node->parent({Class, TypeAlias, Trait, Function});
    }

    std::reverse(path->begin(), path->end());
    node = path->pop_back();

    if (node->in({TypeClassName, TypeAliasName, TypeParamName, TypeTraitName}))
      return FQType << path << node;

    assert(!path->empty());
    auto t = path->pop_back();
    return FQFunction << (FQType << path << t) << node;
  }